

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_llama::llm_build_llama
          (llm_build_llama *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  undefined8 uVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  const_reference pvVar5;
  ggml_tensor *pgVar6;
  char *name;
  ggml_tensor *pgVar7;
  pointer plVar8;
  undefined8 in_RCX;
  long in_RSI;
  int *in_RDI;
  bool bVar9;
  ggml_tensor *shexp_out;
  ggml_tensor *moe_out;
  ggml_tensor *ffn_inp_normed;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *rope_factors;
  bool use_rope;
  ggml_tensor *inpSA;
  int il;
  float kq_scale;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_attn_scale;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffc78;
  int iVar10;
  llm_graph_context *in_stack_fffffffffffffc80;
  ggml_tensor *in_stack_fffffffffffffc88;
  ggml_tensor *in_stack_fffffffffffffc90;
  ggml_tensor *pgVar11;
  ggml_tensor *in_stack_fffffffffffffc98;
  undefined4 uVar12;
  ggml_tensor *cur_00;
  llm_graph_context *in_stack_fffffffffffffca0;
  ggml_tensor *in_stack_fffffffffffffcd0;
  ggml_tensor *in_stack_fffffffffffffcd8;
  llm_graph_context *in_stack_fffffffffffffce0;
  ggml_tensor *in_stack_fffffffffffffcf8;
  ggml_tensor *in_stack_fffffffffffffd00;
  ggml_tensor *in_stack_fffffffffffffd08;
  ggml_tensor *in_stack_fffffffffffffd10;
  ggml_tensor *in_stack_fffffffffffffd18;
  ggml_tensor *in_stack_fffffffffffffd20;
  ggml_tensor *in_stack_fffffffffffffd30;
  ggml_tensor *in_stack_fffffffffffffd38;
  ggml_tensor *in_stack_fffffffffffffd40;
  ggml_tensor *in_stack_fffffffffffffd48;
  ggml_tensor *in_stack_fffffffffffffd50;
  ggml_tensor *in_stack_fffffffffffffd58;
  ggml_tensor *in_stack_fffffffffffffd60;
  undefined1 *in_stack_fffffffffffffd68;
  ggml_tensor *in_stack_fffffffffffffd70;
  ggml_tensor *in_stack_fffffffffffffd78;
  ggml_tensor *in_stack_fffffffffffffd80;
  ggml_tensor *in_stack_fffffffffffffd88;
  llm_graph_context *in_stack_fffffffffffffd90;
  llama_expert_gating_func_type gating_op;
  ggml_tensor *in_stack_fffffffffffffda0;
  ggml_tensor *in_stack_fffffffffffffda8;
  float kq_scale_00;
  ggml_tensor *in_stack_fffffffffffffe48;
  ggml_tensor *in_stack_fffffffffffffe50;
  ggml_tensor *in_stack_fffffffffffffe58;
  ggml_tensor *in_stack_fffffffffffffe60;
  ggml_tensor *in_stack_fffffffffffffe68;
  ggml_tensor *in_stack_fffffffffffffe70;
  ggml_tensor *in_stack_fffffffffffffe90;
  ggml_tensor *in_stack_fffffffffffffe98;
  ggml_tensor *in_stack_fffffffffffffea0;
  ggml_tensor *local_a0;
  undefined8 local_98;
  ggml_tensor *local_90;
  ggml_tensor *local_78;
  int local_70;
  ggml_tensor *local_60;
  ggml_tensor *local_50;
  ggml_tensor *local_48;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffc90,
             (llm_graph_params *)in_stack_fffffffffffffc88);
  uVar1 = *(uint *)(*(long *)(in_RDI + 2) + 0x24);
  if (uVar1 != *(uint *)(*(long *)(in_RDI + 2) + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1147,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  if (uVar1 == *(uint *)(*(long *)(in_RDI + 2) + 0x14)) {
    local_50 = llm_graph_context::build_inp_embd
                         (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    pgVar3 = llm_graph_context::build_inp_pos(in_stack_fffffffffffffce0);
    local_60 = (ggml_tensor *)0x0;
    if (*in_RDI == 1) {
      local_60 = llm_graph_context::build_inp_attn_scale(in_stack_fffffffffffffce0);
    }
    llm_graph_context::build_attn_inp_kv_unified((llm_graph_context *)in_stack_fffffffffffffd20);
    if ((*(float *)(*(long *)(in_RDI + 2) + 0x1900) == 0.0) &&
       (!NAN(*(float *)(*(long *)(in_RDI + 2) + 0x1900)))) {
      sqrtf((float)uVar1);
    }
    for (local_70 = 0; (long)local_70 < *(long *)(in_RDI + 10); local_70 = local_70 + 1) {
      local_78 = local_50;
      if (*in_RDI == 1) {
        bVar9 = (local_70 + 1U) % *(uint *)(*(long *)(in_RDI + 2) + 0x1914) != 0;
      }
      else {
        bVar9 = true;
      }
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_70);
      llm_graph_context::build_norm
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                 in_stack_fffffffffffffc88,(llm_norm_type)((ulong)in_stack_fffffffffffffc80 >> 0x20)
                 ,(int)in_stack_fffffffffffffc80);
      uVar12 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (char *)in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
      pgVar4 = std::function<ggml_tensor_*(unsigned_int,_int)>::operator()
                         ((function<ggml_tensor_*(unsigned_int,_int)> *)in_stack_fffffffffffffc80,
                          (uint)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                          (int)in_stack_fffffffffffffc78);
      iVar10 = (int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_70);
      local_90 = llm_graph_context::build_lora_mm
                           (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                            in_stack_fffffffffffffcd0);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (char *)in_stack_fffffffffffffc80,iVar10);
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_70);
      if (pvVar5->bq != (ggml_tensor *)0x0) {
        uVar2 = *(undefined8 *)(in_RDI + 0x30);
        pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_70);
        local_90 = (ggml_tensor *)ggml_add(uVar2,local_90,pvVar5->bq);
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                   (char *)in_stack_fffffffffffffc80,iVar10);
      }
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_70);
      local_98 = llm_graph_context::build_lora_mm
                           (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                            in_stack_fffffffffffffcd0);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (char *)in_stack_fffffffffffffc80,iVar10);
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_70);
      if (pvVar5->bk != (ggml_tensor *)0x0) {
        uVar2 = *(undefined8 *)(in_RDI + 0x30);
        pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_70);
        local_98 = (ggml_tensor *)ggml_add(uVar2,local_98,pvVar5->bk);
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                   (char *)in_stack_fffffffffffffc80,iVar10);
      }
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_70);
      pgVar6 = llm_graph_context::build_lora_mm
                         (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                          in_stack_fffffffffffffcd0);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (char *)in_stack_fffffffffffffc80,iVar10);
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_70);
      local_a0 = pgVar6;
      if (pvVar5->bv != (ggml_tensor *)0x0) {
        in_stack_fffffffffffffe90 = *(ggml_tensor **)(in_RDI + 0x30);
        pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_70);
        local_a0 = (ggml_tensor *)ggml_add(in_stack_fffffffffffffe90,pgVar6,pvVar5->bv);
        in_stack_fffffffffffffea0 = local_a0;
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                   (char *)in_stack_fffffffffffffc80,iVar10);
        in_stack_fffffffffffffe98 = pgVar6;
      }
      local_90 = (ggml_tensor *)
                 ggml_reshape_3d(*(undefined8 *)(in_RDI + 0x30),local_90,uVar1,
                                 *(undefined8 *)(in_RDI + 0x12),(long)in_RDI[0x2a]);
      pgVar7 = local_90;
      local_98 = (ggml_tensor *)
                 ggml_reshape_3d(*(undefined8 *)(in_RDI + 0x30),local_98,uVar1,
                                 *(undefined8 *)(in_RDI + 0x14),(long)in_RDI[0x2a]);
      pgVar6 = local_98;
      name = (char *)ggml_reshape_3d(*(undefined8 *)(in_RDI + 0x30),local_a0,uVar1,
                                     *(undefined8 *)(in_RDI + 0x14),(long)in_RDI[0x2a]);
      if (bVar9) {
        local_90 = (ggml_tensor *)
                   ggml_rope_ext(in_RDI[0x22],in_RDI[0x23],in_RDI[0x24],in_RDI[0x25],in_RDI[0x26],
                                 in_RDI[0x27],*(undefined8 *)(in_RDI + 0x30),local_90,pgVar3,pgVar4,
                                 in_RDI[0xc],in_RDI[0x2e]);
        in_stack_fffffffffffffe70 = local_90;
        in_stack_fffffffffffffe68 =
             (ggml_tensor *)
             ggml_rope_ext(in_RDI[0x22],in_RDI[0x23],in_RDI[0x24],in_RDI[0x25],in_RDI[0x26],
                           in_RDI[0x27],*(undefined8 *)(in_RDI + 0x30),local_98,pgVar3,pgVar4,
                           in_RDI[0xc],in_RDI[0x2e]);
        local_98 = in_stack_fffffffffffffe68;
      }
      else if (local_60 != (ggml_tensor *)0x0) {
        in_stack_fffffffffffffe60 =
             (ggml_tensor *)ggml_mul(*(undefined8 *)(in_RDI + 0x30),local_90,local_60);
        local_90 = in_stack_fffffffffffffe60;
      }
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (char *)in_stack_fffffffffffffc80,iVar10);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (char *)in_stack_fffffffffffffc80,iVar10);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (char *)in_stack_fffffffffffffc80,iVar10);
      if (((*in_RDI == 1) && (bVar9)) && ((*(byte *)(*(long *)(in_RDI + 2) + 0x190c) & 1) != 0)) {
        in_stack_fffffffffffffe58 =
             (ggml_tensor *)
             ggml_rms_norm(*(undefined4 *)(*(long *)(in_RDI + 2) + 0x1878),
                           *(undefined8 *)(in_RDI + 0x30),local_90);
        local_98 = (ggml_tensor *)
                   ggml_rms_norm(*(undefined4 *)(*(long *)(in_RDI + 2) + 0x1878),
                                 *(undefined8 *)(in_RDI + 0x30),local_98);
        in_stack_fffffffffffffe50 = local_98;
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                   (char *)in_stack_fffffffffffffc80,iVar10);
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                   (char *)in_stack_fffffffffffffc80,iVar10);
      }
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_70);
      kq_scale_00 = (float)((ulong)pvVar5->wo >> 0x20);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_70);
      cur_00 = (ggml_tensor *)CONCAT44(uVar12,local_70);
      pgVar11 = (ggml_tensor *)0x0;
      pgVar4 = (ggml_tensor *)0x0;
      local_48 = llm_graph_context::build_attn
                           ((llm_graph_context *)in_stack_fffffffffffffe70,
                            (llm_graph_input_attn_kv_unified *)in_stack_fffffffffffffe68,
                            (ggml_cgraph *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                            in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,pgVar6,pgVar7,
                            in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,kq_scale_00,
                            (int)in_stack_fffffffffffffea0);
      in_stack_fffffffffffffe48 = local_48;
      llm_graph_context::cb((llm_graph_context *)pgVar11,pgVar4,name,local_98._4_4_);
      if ((long)local_70 == *(long *)(in_RDI + 10) + -1) {
        pgVar6 = llm_graph_context::build_inp_out_ids
                           ((llm_graph_context *)in_stack_fffffffffffffcd0);
        local_48 = (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0x30),local_48,pgVar6);
        local_78 = (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0x30),local_50,pgVar6);
      }
      if ((*(float *)(*(long *)(in_RDI + 2) + 0x18f8) != 0.0) ||
         (NAN(*(float *)(*(long *)(in_RDI + 2) + 0x18f8)))) {
        local_48 = (ggml_tensor *)
                   ggml_scale(*(undefined4 *)(*(long *)(in_RDI + 2) + 0x18f8),
                              *(undefined8 *)(in_RDI + 0x30),local_48);
      }
      pgVar6 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0x30),local_48,local_78);
      llm_graph_context::cb((llm_graph_context *)pgVar11,pgVar4,name,local_98._4_4_);
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_70);
      gating_op = (llama_expert_gating_func_type)in_stack_fffffffffffffda0;
      if (pvVar5->ffn_gate_inp == (ggml_tensor *)0x0) {
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_70);
        llm_graph_context::build_norm
                  (in_stack_fffffffffffffca0,cur_00,pgVar11,pgVar4,
                   (llm_norm_type)((ulong)name >> 0x20),(int)name);
        llm_graph_context::cb((llm_graph_context *)pgVar11,pgVar4,name,local_98._4_4_);
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_70);
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_70);
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_70);
        pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_70);
        in_stack_fffffffffffffc78 = pvVar5->ffn_gate_b;
        pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_70);
        in_stack_fffffffffffffc88 = pvVar5->ffn_down;
        pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_70);
        in_stack_fffffffffffffc90 = pvVar5->ffn_down_b;
        in_stack_fffffffffffffca0 = (llm_graph_context *)0x0;
        in_stack_fffffffffffffc98 = (ggml_tensor *)0x0;
        in_stack_fffffffffffffc80 = (llm_graph_context *)0x0;
        local_48 = llm_graph_context::build_ffn
                             ((llm_graph_context *)in_stack_fffffffffffffd20,
                              in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                              in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                              in_stack_fffffffffffffcf8,in_stack_fffffffffffffd30,
                              in_stack_fffffffffffffd38,in_stack_fffffffffffffd40,
                              in_stack_fffffffffffffd48,in_stack_fffffffffffffd50,
                              in_stack_fffffffffffffd58,(llm_ffn_op_type)in_stack_fffffffffffffd60,
                              (llm_ffn_gate_type)in_stack_fffffffffffffd68,
                              (int)in_stack_fffffffffffffd70);
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                   (char *)in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20)
                  );
      }
      else if (*in_RDI == 1) {
        in_stack_fffffffffffffda8 = pgVar6;
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_70);
        pgVar7 = llm_graph_context::build_norm
                           (in_stack_fffffffffffffca0,cur_00,pgVar11,pgVar4,
                            (llm_norm_type)((ulong)name >> 0x20),(int)name);
        llm_graph_context::cb((llm_graph_context *)pgVar11,pgVar4,name,local_98._4_4_);
        in_stack_fffffffffffffd78 = pgVar7;
        pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_70);
        in_stack_fffffffffffffd80 = pvVar5->ffn_gate_inp;
        pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_70);
        in_stack_fffffffffffffd88 = pvVar5->ffn_up_exps;
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_70);
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_70);
        pgVar4 = llm_graph_context::build_moe_ffn
                           ((llm_graph_context *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58
                            ,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                            in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                            in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd78,
                            (int64_t)in_stack_fffffffffffffd80,
                            (llm_ffn_op_type)in_stack_fffffffffffffd88,
                            SUB81((ulong)in_stack_fffffffffffffd30 >> 0x38,0),
                            SUB81((ulong)in_stack_fffffffffffffd30 >> 0x30,0),
                            SUB84(in_stack_fffffffffffffd30,0),gating_op,
                            (int)in_stack_fffffffffffffda8);
        iVar10 = (int)in_stack_fffffffffffffd70;
        in_stack_fffffffffffffda0 = pgVar4;
        pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_70);
        in_stack_fffffffffffffd58 = pvVar5->ffn_up_shexp;
        pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_70);
        in_stack_fffffffffffffd60 = pvVar5->ffn_gate_shexp;
        pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_70);
        in_stack_fffffffffffffc88 = pvVar5->ffn_down_shexp;
        in_stack_fffffffffffffca0 = (llm_graph_context *)0x0;
        in_stack_fffffffffffffc98 = (ggml_tensor *)0x0;
        in_stack_fffffffffffffc90 = (ggml_tensor *)0x0;
        in_stack_fffffffffffffc80 = (llm_graph_context *)0x0;
        in_stack_fffffffffffffc78 = (ggml_tensor *)0x0;
        in_stack_fffffffffffffd68 = &stack0xfffffffffffffc78;
        pgVar11 = llm_graph_context::build_ffn
                            ((llm_graph_context *)in_stack_fffffffffffffd20,
                             in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                             in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                             in_stack_fffffffffffffcf8,in_stack_fffffffffffffd30,
                             in_stack_fffffffffffffd38,in_stack_fffffffffffffd40,
                             in_stack_fffffffffffffd48,pgVar7,in_stack_fffffffffffffd58,
                             (llm_ffn_op_type)in_stack_fffffffffffffd60,
                             (llm_ffn_gate_type)&stack0xfffffffffffffc78,iVar10);
        in_stack_fffffffffffffd70 = pgVar11;
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                   (char *)in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20)
                  );
        local_48 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0x30),pgVar4,pgVar11);
        in_stack_fffffffffffffd48 = local_48;
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                   (char *)in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20)
                  );
        in_stack_fffffffffffffd50 = pgVar7;
      }
      else {
        in_stack_fffffffffffffd38 = pgVar6;
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_70);
        in_stack_fffffffffffffd08 =
             llm_graph_context::build_norm
                       (in_stack_fffffffffffffca0,cur_00,pgVar11,pgVar4,
                        (llm_norm_type)((ulong)name >> 0x20),(int)name);
        uVar12 = (undefined4)((ulong)cur_00 >> 0x20);
        in_stack_fffffffffffffd40 = in_stack_fffffffffffffd08;
        llm_graph_context::cb((llm_graph_context *)pgVar11,pgVar4,name,local_98._4_4_);
        pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_70);
        in_stack_fffffffffffffd10 = pvVar5->ffn_gate_inp;
        pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_70);
        in_stack_fffffffffffffd18 = pvVar5->ffn_up_exps;
        pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_70);
        in_stack_fffffffffffffd20 = pvVar5->ffn_gate_exps;
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_70);
        in_stack_fffffffffffffc80 = *(llm_graph_context **)(in_RDI + 0x1e);
        in_stack_fffffffffffffc88 = *(ggml_tensor **)(in_RDI + 0x20);
        in_stack_fffffffffffffca0 =
             (llm_graph_context *)((ulong)in_stack_fffffffffffffca0 & 0xffffffff00000000);
        in_stack_fffffffffffffc98 = (ggml_tensor *)CONCAT44(uVar12,1);
        in_stack_fffffffffffffc90 = (ggml_tensor *)((ulong)pgVar11 & 0xffffffff00000000);
        in_stack_fffffffffffffc78 = (ggml_tensor *)0x0;
        local_48 = llm_graph_context::build_moe_ffn
                             ((llm_graph_context *)in_stack_fffffffffffffd60,
                              in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                              in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                              in_stack_fffffffffffffd38,in_stack_fffffffffffffd70,
                              (int64_t)in_stack_fffffffffffffd78,(int64_t)in_stack_fffffffffffffd80,
                              (llm_ffn_op_type)in_stack_fffffffffffffd88,
                              SUB81((ulong)in_stack_fffffffffffffd30 >> 0x38,0),
                              SUB81((ulong)in_stack_fffffffffffffd30 >> 0x30,0),
                              SUB84(in_stack_fffffffffffffd30,0),
                              (llama_expert_gating_func_type)in_stack_fffffffffffffda0,
                              (int)in_stack_fffffffffffffda8);
        in_stack_fffffffffffffd30 = local_48;
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                   (char *)in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20)
                  );
      }
      if ((*(float *)(*(long *)(in_RDI + 2) + 0x18f8) != 0.0) ||
         (NAN(*(float *)(*(long *)(in_RDI + 2) + 0x18f8)))) {
        in_stack_fffffffffffffd00 =
             (ggml_tensor *)
             ggml_scale(*(undefined4 *)(*(long *)(in_RDI + 2) + 0x18f8),
                        *(undefined8 *)(in_RDI + 0x30),local_48);
        local_48 = in_stack_fffffffffffffd00;
      }
      in_stack_fffffffffffffcf8 =
           (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0x30),local_48,pgVar6);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (char *)in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
      local_50 = llm_graph_context::build_cvec
                           (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,0);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                 (char *)in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
    }
    pgVar3 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                        in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                        (int)in_stack_fffffffffffffc80);
    iVar10 = (int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               (char *)in_stack_fffffffffffffc80,iVar10);
    plVar8 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                       ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                        0x4bfa09);
    plVar8->t_embd = pgVar3;
    local_48 = llm_graph_context::build_lora_mm
                         (in_stack_fffffffffffffce0,pgVar3,in_stack_fffffffffffffcd0);
    if ((*(float *)(*(long *)(in_RDI + 2) + 0x18f4) != 0.0) ||
       (NAN(*(float *)(*(long *)(in_RDI + 2) + 0x18f4)))) {
      local_48 = (ggml_tensor *)
                 ggml_scale(1.0 / *(float *)(*(long *)(in_RDI + 2) + 0x18f4),
                            *(undefined8 *)(in_RDI + 0x30),local_48);
    }
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               (char *)in_stack_fffffffffffffc80,iVar10);
    plVar8 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                       ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                        0x4bfaf6);
    plVar8->t_logits = local_48;
    ggml_build_forward_expand(in_RCX,local_48);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,0x1148,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_rot");
}

Assistant:

llm_build_llama(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        // temperature tuning
        ggml_tensor * inp_attn_scale = nullptr;
        if (arch == LLM_ARCH_LLAMA4) {
            inp_attn_scale = build_inp_attn_scale();
        }

        auto * inp_attn = build_attn_inp_kv_unified();

        const float kq_scale = hparams.f_attention_scale == 0.0f ? 1.0f/sqrtf(float(n_embd_head)) : hparams.f_attention_scale;
        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            bool use_rope = arch == LLM_ARCH_LLAMA4
                ? (il + 1) % hparams.n_no_rope_layer_step != 0
                : true;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                // rope freq factors for llama3; may return nullptr for llama2 and other models
                ggml_tensor * rope_factors = static_cast<const llama_kv_cache_unified *>(memory)->cbs.get_rope_factors(n_ctx_per_seq, il);

                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);
                if (model.layers[il].bq) {
                    Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                    cb(Qcur, "Qcur", il);
                }

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);
                if (model.layers[il].bk) {
                    Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                    cb(Kcur, "Kcur", il);
                }

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);
                if (model.layers[il].bv) {
                    Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                    cb(Vcur, "Vcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                if (use_rope) {
                    Qcur = ggml_rope_ext(
                            ctx0, Qcur, inp_pos, rope_factors,
                            n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                            ext_factor, attn_factor, beta_fast, beta_slow
                            );

                    Kcur = ggml_rope_ext(
                            ctx0, Kcur, inp_pos, rope_factors,
                            n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                            ext_factor, attn_factor, beta_fast, beta_slow
                            );
                } else if (inp_attn_scale) {
                    Qcur = ggml_mul(ctx0, Qcur, inp_attn_scale);
                }

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                if (arch == LLM_ARCH_LLAMA4 && use_rope && hparams.use_kq_norm) {
                    // Llama4TextL2Norm
                    Qcur = ggml_rms_norm(ctx0, Qcur, hparams.f_norm_rms_eps);
                    Kcur = ggml_rms_norm(ctx0, Kcur, hparams.f_norm_rms_eps);
                    cb(Qcur, "Qcur_normed", il);
                    cb(Kcur, "Kcur_normed", il);
                }

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, kq_scale, il);
                cb(cur, "attn_out", il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            // For Granite architecture
            if (hparams.f_residual_scale) {
                cur = ggml_scale(ctx0, cur, hparams.f_residual_scale);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network (non-MoE)
            if (model.layers[il].ffn_gate_inp == nullptr) {

                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   model.layers[il].ffn_up_b,   NULL,
                        model.layers[il].ffn_gate, model.layers[il].ffn_gate_b, NULL,
                        model.layers[il].ffn_down, model.layers[il].ffn_down_b, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);

            } else if (arch == LLM_ARCH_LLAMA4) {
                // llama4 MoE
                ggml_tensor * ffn_inp_normed = build_norm(ffn_inp,
                        model.layers[il].ffn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                ggml_tensor * moe_out = build_moe_ffn(ffn_inp_normed,
                        model.layers[il].ffn_gate_inp,
                        model.layers[il].ffn_up_exps,
                        model.layers[il].ffn_gate_exps,
                        model.layers[il].ffn_down_exps,
                        nullptr,
                        n_expert, n_expert_used,
                        LLM_FFN_SILU, false,
                        false, 0.0,
                        LLAMA_EXPERT_GATING_FUNC_TYPE_SIGMOID,
                        il);

                // Shared experts
                ggml_tensor * shexp_out = build_ffn(ffn_inp_normed,
                    model.layers[il].ffn_up_shexp,   NULL, NULL,
                    model.layers[il].ffn_gate_shexp, NULL, NULL,
                    model.layers[il].ffn_down_shexp, NULL, NULL,
                    NULL,
                    LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(shexp_out, "ffn_moe_shexp", il);

                cur = ggml_add(ctx0, moe_out, shexp_out);
                cb(cur, "ffn_moe_out_merged", il);

            } else {
                // MoE branch
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                cur = build_moe_ffn(cur,
                        model.layers[il].ffn_gate_inp,
                        model.layers[il].ffn_up_exps,
                        model.layers[il].ffn_gate_exps,
                        model.layers[il].ffn_down_exps,
                        nullptr,
                        n_expert, n_expert_used,
                        LLM_FFN_SILU, true,
                        false, 0.0,
                        LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,
                        il);
                cb(cur, "ffn_moe_out", il);
            }

            // For Granite architecture
            if (hparams.f_residual_scale) {
                cur = ggml_scale(ctx0, cur, hparams.f_residual_scale);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);
            cb(cur, "ffn_out", il);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        // For Granite architecture
        if (hparams.f_logit_scale) {
            cur = ggml_scale(ctx0, cur, 1.0f / hparams.f_logit_scale);
        }

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }